

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void train(svm_params *params)

{
  bool *pbVar1;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  double *__ptr;
  size_t sVar5;
  ostream *this;
  long in_RDI;
  float fVar6;
  double dVar7;
  __type_conflict _Var8;
  size_t i_5;
  size_t rand_pos;
  size_t max_pos;
  size_t in_stack_00000068;
  int randi;
  size_t j;
  double *subopt;
  bool overshoot;
  int model_pos;
  size_t i_4;
  svm_model *model;
  size_t i_3;
  svm_example *fec;
  float queryp;
  size_t i_2;
  size_t train_size;
  iterator iter;
  size_t i_1;
  multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  scoremap;
  float *scores;
  size_t i;
  bool *train_pool;
  multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  *in_stack_fffffffffffffe98;
  void *pvVar9;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  svm_example *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  size_t in_stack_fffffffffffffee8;
  ulong uVar10;
  float *in_stack_fffffffffffffef0;
  svm_example **in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar11;
  ulong local_f8;
  int local_e4;
  ulong local_e0;
  ulong *svi;
  svm_params *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  svm_params *in_stack_ffffffffffffff48;
  _Self in_stack_ffffffffffffff50;
  _Self local_a8;
  ulong local_a0;
  _Base_ptr local_98;
  _Self local_90;
  _Base_ptr local_88;
  float local_6c;
  pair<const_double,_const_unsigned_long> local_68;
  unsigned_long local_58 [7];
  float *local_20;
  ulong local_18;
  bool *local_10;
  long local_8;
  
  local_8 = in_RDI;
  local_10 = calloc_or_throw<bool>(in_stack_00000068);
  for (local_18 = 0; local_18 < *(ulong *)(local_8 + 0x18); local_18 = local_18 + 1) {
    local_10[local_18] = false;
  }
  local_20 = calloc_or_throw<float>(in_stack_00000068);
  predict((svm_params *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
          in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if ((*(byte *)(local_8 + 8) & 1) != 0) {
    if ((*(byte *)(local_8 + 9) & 1) == 0) {
      for (in_stack_ffffffffffffff48 = (svm_params *)0x0;
          in_stack_ffffffffffffff48 < *(svm_params **)(local_8 + 0x20);
          in_stack_ffffffffffffff48 =
               (svm_params *)((long)&in_stack_ffffffffffffff48->current_pass + 1)) {
        in_stack_fffffffffffffeb8 = *(double **)(local_8 + 0x10);
        dVar7 = std::fabs((double)(ulong)(uint)local_20[(long)in_stack_ffffffffffffff48]);
        in_stack_fffffffffffffec4 =
             (float)((double)in_stack_fffffffffffffeb8 * (double)SUB84(dVar7,0));
        _Var8 = std::pow<unsigned_long,float>
                          (CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        fVar6 = expf(in_stack_fffffffffffffec4 * (float)_Var8);
        in_stack_ffffffffffffff44 = 2.0 / (fVar6 + 1.0);
        fVar6 = merand48((uint64_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        if (fVar6 < in_stack_ffffffffffffff44) {
          in_stack_ffffffffffffff38 =
               *(size_t *)(*(long *)(local_8 + 0x48) + (long)in_stack_ffffffffffffff48 * 8);
          *(float *)(in_stack_ffffffffffffff38 + 0x24) =
               (1.0 / in_stack_ffffffffffffff44) * *(float *)(in_stack_ffffffffffffff38 + 0x24);
          local_10[(long)in_stack_ffffffffffffff48] = true;
        }
      }
    }
    else {
      std::
      multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
      ::multimap((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                  *)0x39ba3b);
      for (local_58[0] = 0; local_58[0] < *(ulong *)(local_8 + 0x20); local_58[0] = local_58[0] + 1)
      {
        dVar7 = std::fabs((double)(ulong)(uint)local_20[local_58[0]]);
        local_6c = SUB84(dVar7,0);
        std::pair<const_double,_const_unsigned_long>::pair<float,_unsigned_long_&,_true>
                  (&local_68,&local_6c,local_58);
        local_88 = (_Base_ptr)
                   std::
                   multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                   ::insert<std::pair<double_const,unsigned_long_const>>
                             (in_stack_fffffffffffffe98,
                              (pair<const_double,_const_unsigned_long> *)0x39bac6);
      }
      local_90._M_node =
           (_Base_ptr)
           std::
           multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
           ::begin(in_stack_fffffffffffffe98);
      local_98 = (_Base_ptr)
                 std::
                 multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                 ::begin(in_stack_fffffffffffffe98);
      local_a0 = 1;
      local_90._M_node = local_98;
      while( true ) {
        local_a8._M_node =
             (_Base_ptr)
             std::
             multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
             ::end(in_stack_fffffffffffffe98);
        bVar2 = std::operator!=(&local_90,&local_a8);
        pbVar1 = local_10;
        bVar3 = false;
        if (bVar2) {
          bVar3 = local_a0 <= *(ulong *)(local_8 + 0x28);
        }
        if (!bVar3) break;
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> *)0x39bbd7);
        pbVar1[ppVar4->second] = true;
        in_stack_ffffffffffffff50 =
             std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator++
                       ((_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        (int)in_stack_fffffffffffffea4);
        local_a0 = local_a0 + 1;
      }
      std::
      multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
      ::~multimap((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                   *)0x39bc24);
    }
  }
  if ((*(byte *)(local_8 + 10) & 1) != 0) {
    for (in_stack_ffffffffffffff30 = (svm_params *)0x0;
        in_stack_ffffffffffffff30 < *(svm_params **)(local_8 + 0x20);
        in_stack_ffffffffffffff30 =
             (svm_params *)((long)&in_stack_ffffffffffffff30->current_pass + 1)) {
      if (((local_10[(long)in_stack_ffffffffffffff30] & 1U) == 0) &&
         (in_stack_fffffffffffffeb0 =
               *(svm_example **)(*(long *)(local_8 + 0x48) + (long)in_stack_ffffffffffffff30 * 8),
         in_stack_fffffffffffffeb0 != (svm_example *)0x0)) {
        svm_example::~svm_example(in_stack_fffffffffffffeb0);
        operator_delete(in_stack_fffffffffffffeb0);
      }
    }
    sync_queries((vw *)in_stack_ffffffffffffff50._M_node,in_stack_ffffffffffffff48,
                 (bool *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  if ((*(byte *)(*(long *)(local_8 + 0x88) + 0x343a) & 1) == 0) {
    for (uVar10 = 0; uVar10 < *(ulong *)(local_8 + 0x20); uVar10 = uVar10 + 1) {
      pvVar9 = *(void **)(*(long *)(local_8 + 0x48) + uVar10 * 8);
      if (pvVar9 != (void *)0x0) {
        svm_example::~svm_example(in_stack_fffffffffffffeb0);
        operator_delete(pvVar9);
      }
    }
  }
  else {
    svi = *(ulong **)(local_8 + 0x38);
    for (local_e0 = 0; local_e0 < *(ulong *)(local_8 + 0x20); local_e0 = local_e0 + 1) {
      local_e4 = -1;
      if ((*(byte *)(local_8 + 8) & 1) == 0) {
        local_e4 = add((svm_params *)in_stack_fffffffffffffeb0,
                       (svm_example *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
        ;
      }
      else if ((local_10[local_e0] & 1U) != 0) {
        local_e4 = add((svm_params *)in_stack_fffffffffffffeb0,
                       (svm_example *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
        ;
      }
      if (-1 < local_e4) {
        bVar3 = update((svm_params *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
        __ptr = calloc_or_throw<double>(in_stack_00000068);
        local_f8 = 0;
        while ((local_f8 < *(ulong *)(local_8 + 0x30) && (*svi != 0))) {
          iVar11 = 1;
          fVar6 = merand48((uint64_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                          );
          if (fVar6 < 0.5) {
            iVar11 = 0;
          }
          if (iVar11 == 0) {
            in_stack_fffffffffffffea4 =
                 merand48((uint64_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
            ;
            in_stack_fffffffffffffea8 = (float)(long)*svi;
            in_stack_fffffffffffffeac = (float)*svi;
            floorf(in_stack_fffffffffffffea4 * in_stack_fffffffffffffeac);
            update((svm_params *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
          }
          else {
            sVar5 = suboptimality((svm_model *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  in_stack_fffffffffffffeb8);
            if (0.0 < __ptr[sVar5]) {
              if ((((!bVar3) && (sVar5 == (long)local_e4)) && (sVar5 != 0)) && (local_f8 == 0)) {
                this = std::operator<<((ostream *)(*(long *)(local_8 + 0x88) + 0xe0),
                                       "Shouldn\'t reprocess right after process!!!");
                std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
              }
              if (sVar5 * *svi < *(ulong *)(local_8 + 0x40) ||
                  sVar5 * *svi - *(ulong *)(local_8 + 0x40) == 0) {
                make_hot_sv(in_stack_ffffffffffffff30,(size_t)svi);
              }
              update((svm_params *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
            }
          }
          local_f8 = local_f8 + 1;
        }
        free(__ptr);
      }
    }
  }
  free(local_20);
  free(local_10);
  return;
}

Assistant:

void train(svm_params& params)
{
  // params.all->opts_n_args.trace_message<<"In train "<<params.all->training<<endl;

  bool* train_pool = calloc_or_throw<bool>(params.pool_size);
  for (size_t i = 0; i < params.pool_size; i++) train_pool[i] = false;

  float* scores = calloc_or_throw<float>(params.pool_pos);
  predict(params, params.pool, scores, params.pool_pos);
  // cout<<scores[0]<<endl;

  if (params.active)
  {
    if (params.active_pool_greedy)
    {
      multimap<double, size_t> scoremap;
      for (size_t i = 0; i < params.pool_pos; i++)
        scoremap.insert(pair<const double, const size_t>(fabs(scores[i]), i));

      multimap<double, size_t>::iterator iter = scoremap.begin();
      // params.all->opts_n_args.trace_message<<params.pool_size<<" "<<"Scoremap: ";
      // for(;iter != scoremap.end();iter++)
      // params.all->opts_n_args.trace_message<<iter->first<<" "<<iter->second<<"
      // "<<((label_data*)params.pool[iter->second]->ld)->label<<"\t"; params.all->opts_n_args.trace_message<<endl;
      iter = scoremap.begin();

      for (size_t train_size = 1; iter != scoremap.end() && train_size <= params.subsample; train_size++)
      {
        // params.all->opts_n_args.trace_message<<train_size<<" "<<iter->second<<" "<<iter->first<<endl;
        train_pool[iter->second] = 1;
        iter++;
      }
    }
    else
    {
      for (size_t i = 0; i < params.pool_pos; i++)
      {
        float queryp = 2.0f /
            (1.0f +
                expf(
                    (float)(params.active_c * fabs(scores[i])) * (float)pow(params.pool[i]->ex.example_counter, 0.5f)));
        if (merand48(params.all->random_state) < queryp)
        {
          svm_example* fec = params.pool[i];
          fec->ex.l.simple.weight *= 1 / queryp;
          train_pool[i] = 1;
        }
      }
    }
    // free(scores);
  }

  if (params.para_active)
  {
    for (size_t i = 0; i < params.pool_pos; i++)
      if (!train_pool[i])
        delete params.pool[i];
    sync_queries(*(params.all), params, train_pool);
  }

  if (params.all->training)
  {
    svm_model* model = params.model;

    for (size_t i = 0; i < params.pool_pos; i++)
    {
      // params.all->opts_n_args.trace_message<<"process: "<<i<<" "<<train_pool[i]<<endl;;
      int model_pos = -1;
      if (params.active)
      {
        if (train_pool[i])
        {
          // params.all->opts_n_args.trace_message<<"i = "<<i<<"train_pool[i] = "<<train_pool[i]<<"
          // "<<params.pool[i]->example_counter<<endl;
          model_pos = add(params, params.pool[i]);
        }
      }
      else
        model_pos = add(params, params.pool[i]);

      // params.all->opts_n_args.trace_message<<"Added: "<<model_pos<<"
      // "<<model->support_vec[model_pos]->example_counter<<endl; cout<<"After adding in train
      // "<<model->num_support<<endl;

      if (model_pos >= 0)
      {
        bool overshoot = update(params, model_pos);
        // cout<<model_pos<<":alpha = "<<model->alpha[model_pos]<<endl;

        double* subopt = calloc_or_throw<double>(model->num_support);
        for (size_t j = 0; j < params.reprocess; j++)
        {
          if (model->num_support == 0)
            break;
          // cout<<"reprocess: ";
          int randi = 1;
          if (merand48(params.all->random_state) < 0.5)
            randi = 0;
          if (randi)
          {
            size_t max_pos = suboptimality(model, subopt);
            if (subopt[max_pos] > 0)
            {
              if (!overshoot && max_pos == (size_t)model_pos && max_pos > 0 && j == 0)
                params.all->trace_message << "Shouldn't reprocess right after process!!!" << endl;
              // cout<<max_pos<<" "<<subopt[max_pos]<<endl;
              // cout<<params.model->support_vec[0]->example_counter<<endl;
              if (max_pos * model->num_support <= params.maxcache)
                make_hot_sv(params, max_pos);
              update(params, max_pos);
            }
          }
          else
          {
            size_t rand_pos = (size_t)floorf(merand48(params.all->random_state) * model->num_support);
            update(params, rand_pos);
          }
        }
        // cout<<endl;
        // cout<<params.model->support_vec[0]->example_counter<<endl;
        free(subopt);
      }
    }
  }
  else
    for (size_t i = 0; i < params.pool_pos; i++) delete params.pool[i];

  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  // for(int i = 0;i < params.pool_size;i++)
  //   params.all->opts_n_args.trace_message<<scores[i]<<" ";
  // params.all->opts_n_args.trace_message<<endl;
  free(scores);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  free(train_pool);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
}